

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O0

void __thiscall
hungarian_algorithm::
BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
::doSolve(BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
          *this,size_t row,CombinedCost *accumulated_cost)

{
  unsigned_long uVar1;
  bool bVar2;
  const_reference rhs;
  reference puVar3;
  unsigned_long local_88;
  undefined1 local_80 [8];
  CombinedCost new_accumulated_cost_1;
  reference local_60;
  duration<long,_boost::ratio<1L,_1L>_> local_50;
  undefined1 local_48 [8];
  CombinedCost new_accumulated_cost;
  ulong local_28;
  size_t col;
  CombinedCost *accumulated_cost_local;
  size_t row_local;
  BruteForceSolver<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>,_std::greater<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>,_unsigned_long>
  *this_local;
  
  if (row < this->num_rows_) {
    for (local_28 = 0; local_28 < this->num_cols_; local_28 = local_28 + 1) {
      join_0x00000010_0x00000000_ =
           std::vector<bool,_std::allocator<bool>_>::operator[](&this->covered_cols_,local_28);
      bVar2 = std::_Bit_reference::operator_cast_to_bool
                        ((_Bit_reference *)&new_accumulated_cost.second);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        rhs = boost::numeric::ublas::
              matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
              ::operator()(this->cost_function_,row,local_28);
        local_50.rep_ = (rep)boost::chrono::operator+(&accumulated_cost->second,rhs);
        std::pair<unsigned_long,_boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>::pair
                  ((pair<unsigned_long,_boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *)
                   local_48,&accumulated_cost->first,&local_50);
        puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->current_assignment_,row);
        *puVar3 = local_28;
        local_60 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->covered_cols_,local_28);
        std::_Bit_reference::operator=(&local_60,true);
        doSolve(this,row + 1,(CombinedCost *)local_48);
        join_0x00000010_0x00000000_ =
             std::vector<bool,_std::allocator<bool>_>::operator[](&this->covered_cols_,local_28);
        std::_Bit_reference::operator=((_Bit_reference *)&new_accumulated_cost_1.second,false);
      }
    }
    if (this->num_cols_ < this->num_rows_) {
      local_88 = accumulated_cost->first + 1;
      std::pair<unsigned_long,_boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>::pair
                ((pair<unsigned_long,_boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *)
                 local_80,&local_88,&accumulated_cost->second);
      uVar1 = this->num_cols_;
      puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->current_assignment_,row);
      *puVar3 = uVar1;
      doSolve(this,row + 1,(CombinedCost *)local_80);
    }
  }
  else {
    bVar2 = isBetterThan(this,accumulated_cost,&this->optimal_cost_);
    if (bVar2) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                (&this->optimal_assignment_,&this->current_assignment_);
      std::pair<unsigned_long,_boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>::operator=
                (&this->optimal_cost_,accumulated_cost);
    }
  }
  return;
}

Assistant:

void doSolve(const std::size_t row, const CombinedCost& accumulated_cost)
  {
    if (row < num_rows_)
    {
      for (std::size_t col = 0; col < num_cols_; ++col)
      {
        if (!covered_cols_[col])
        {
          const CombinedCost new_accumulated_cost(accumulated_cost.first,
                                                  accumulated_cost.second + cost_function_(Size(row), Size(col)));
          current_assignment_[row] = col;
          covered_cols_[col] = true;
          doSolve(row + 1, new_accumulated_cost);
          covered_cols_[col] = false;
        }
      }

      if (num_cols_ < num_rows_)
      {
        // One possibility is also an invalid assignment:
        const CombinedCost new_accumulated_cost(accumulated_cost.first + 1, accumulated_cost.second);
        current_assignment_[static_cast<std::size_t>(row)] = num_cols_;
        doSolve(row + 1, new_accumulated_cost);
      }
    }
    else if (isBetterThan(accumulated_cost, optimal_cost_))
    {
      optimal_assignment_ = current_assignment_;
      optimal_cost_ = accumulated_cost;
    }
  }